

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_filter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2520fc::AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test::TestBody
          (AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test *this)

{
  AV1HighbdSelfguidedFilterTest *in_stack_00000228;
  
  AV1HighbdSelfguidedFilterTest::RunSpeedTest(in_stack_00000228);
  return;
}

Assistant:

TEST_P(AV1HighbdSelfguidedFilterTest, DISABLED_SpeedTest) { RunSpeedTest(); }